

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void T1_Done_Blend(T1_Face face)

{
  uint uVar1;
  uint uVar2;
  PS_Blend pPVar3;
  FT_Memory memory;
  long lVar4;
  ulong uVar5;
  
  pPVar3 = face->blend;
  if (pPVar3 != (PS_Blend)0x0) {
    memory = (face->root).memory;
    uVar1 = pPVar3->num_designs;
    uVar2 = pPVar3->num_axis;
    ft_mem_free(memory,pPVar3->design_pos[0]);
    pPVar3->design_pos[0] = (FT_Fixed *)0x0;
    for (lVar4 = 6; lVar4 - 5U < (ulong)uVar1; lVar4 = lVar4 + 1) {
      pPVar3->axis_names[lVar4 + -1] = (FT_String *)0x0;
    }
    ft_mem_free(memory,pPVar3->privates[1]);
    pPVar3->privates[1] = (PS_Private)0x0;
    ft_mem_free(memory,pPVar3->font_infos[1]);
    pPVar3->font_infos[1] = (PS_FontInfo)0x0;
    ft_mem_free(memory,pPVar3->bboxes[1]);
    pPVar3->bboxes[1] = (FT_BBox *)0x0;
    for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      pPVar3->privates[uVar5] = (PS_Private)0x0;
      pPVar3->font_infos[uVar5] = (PS_FontInfo)0x0;
      pPVar3->bboxes[uVar5] = (FT_BBox *)0x0;
    }
    ft_mem_free(memory,pPVar3->weight_vector);
    pPVar3->weight_vector = (FT_Fixed *)0x0;
    pPVar3->default_weight_vector = (FT_Fixed *)0x0;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      ft_mem_free(memory,pPVar3->axis_names[uVar5]);
      pPVar3->axis_names[uVar5] = (FT_String *)0x0;
    }
    for (lVar4 = 0; (ulong)uVar2 * 0x18 - lVar4 != 0; lVar4 = lVar4 + 0x18) {
      ft_mem_free(memory,*(void **)((long)&pPVar3->design_map[0].design_points + lVar4));
      *(undefined8 *)((long)&pPVar3->design_map[0].design_points + lVar4) = 0;
      (&pPVar3->design_map[0].num_points)[lVar4] = '\0';
    }
    ft_mem_free(memory,face->blend);
    face->blend = (PS_Blend)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Done_Blend( T1_Face  face )
  {
    FT_Memory  memory = face->root.memory;
    PS_Blend   blend  = face->blend;


    if ( blend )
    {
      FT_UInt  num_designs = blend->num_designs;
      FT_UInt  num_axis    = blend->num_axis;
      FT_UInt  n;


      /* release design pos table */
      FT_FREE( blend->design_pos[0] );
      for ( n = 1; n < num_designs; n++ )
        blend->design_pos[n] = NULL;

      /* release blend `private' and `font info' dictionaries */
      FT_FREE( blend->privates[1] );
      FT_FREE( blend->font_infos[1] );
      FT_FREE( blend->bboxes[1] );

      for ( n = 0; n < num_designs; n++ )
      {
        blend->privates  [n] = NULL;
        blend->font_infos[n] = NULL;
        blend->bboxes    [n] = NULL;
      }

      /* release weight vectors */
      FT_FREE( blend->weight_vector );
      blend->default_weight_vector = NULL;

      /* release axis names */
      for ( n = 0; n < num_axis; n++ )
        FT_FREE( blend->axis_names[n] );

      /* release design map */
      for ( n = 0; n < num_axis; n++ )
      {
        PS_DesignMap  dmap = blend->design_map + n;


        FT_FREE( dmap->design_points );
        dmap->num_points = 0;
      }

      FT_FREE( face->blend );
    }
  }